

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall gvr::Mesh::recalculateNormals(Mesh *this)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  iVar2 = (this->super_PointCloud).n;
  if (0 < iVar2) {
    iVar5 = iVar2 * 3;
    iVar6 = 1;
    if (iVar5 < 1) {
      iVar6 = iVar5;
    }
    memset(this->normal + ((ulong)(iVar2 * 3 - 1) - (ulong)(uint)(iVar5 - iVar6)),0,
           (ulong)(uint)(iVar5 - iVar6) * 4 + 4);
  }
  if (0 < this->n) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      pfVar3 = (this->super_PointCloud).vertex;
      puVar4 = this->triangle;
      fVar11 = pfVar3[(long)(int)puVar4[lVar10 * 3 + 1] * 3] -
               pfVar3[(long)(int)puVar4[lVar10 * 3] * 3];
      lVar7 = (long)(int)(puVar4[lVar10 * 3 + 1] * 3);
      lVar8 = (long)(int)(puVar4[lVar10 * 3] * 3);
      fVar12 = pfVar3[lVar7 + 1] - pfVar3[lVar8 + 1];
      fVar16 = pfVar3[lVar7 + 2] - pfVar3[lVar8 + 2];
      fVar13 = pfVar3[(long)(int)puVar4[lVar10 * 3 + 2] * 3] -
               pfVar3[(long)(int)puVar4[lVar10 * 3] * 3];
      lVar7 = (long)(int)(puVar4[lVar10 * 3 + 2] * 3);
      fVar17 = pfVar3[lVar7 + 1] - pfVar3[lVar8 + 1];
      fVar14 = pfVar3[lVar7 + 2] - pfVar3[lVar8 + 2];
      fVar15 = fVar12 * fVar14 - fVar17 * fVar16;
      fVar14 = fVar16 * fVar13 - fVar14 * fVar11;
      fVar12 = fVar17 * fVar11 - fVar13 * fVar12;
      fVar11 = fVar12 * fVar12 + fVar15 * fVar15 + fVar14 * fVar14;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      if (0.0 < fVar11) {
        pfVar3 = this->normal;
        puVar4 = this->triangle;
        lVar7 = 0;
        do {
          iVar2 = *(int *)((long)puVar4 + lVar7 * 4 + lVar9);
          pfVar3[(uint)(iVar2 * 3)] = pfVar3[(uint)(iVar2 * 3)] + fVar15 / fVar11;
          uVar1 = iVar2 * 3 + 1;
          pfVar3[uVar1] = pfVar3[uVar1] + fVar14 / fVar11;
          uVar1 = iVar2 * 3 + 2;
          pfVar3[uVar1] = pfVar3[uVar1] + fVar12 / fVar11;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar10 < this->n);
  }
  normalizeNormals(this);
  return;
}

Assistant:

void Mesh::recalculateNormals()
{
  for (int i=3*getVertexCount()-1; i>=0; i--)
  {
    normal[i]=0;
  }

  /* compute normals of triangles and sum for each vertex */

  for (int i=0; i<n; i++)
  {
    float x0=getVertexComp(triangle[3*i+1], 0)-getVertexComp(triangle[3*i], 0);
    float y0=getVertexComp(triangle[3*i+1], 1)-getVertexComp(triangle[3*i], 1);
    float z0=getVertexComp(triangle[3*i+1], 2)-getVertexComp(triangle[3*i], 2);

    float x1=getVertexComp(triangle[3*i+2], 0)-getVertexComp(triangle[3*i], 0);
    float y1=getVertexComp(triangle[3*i+2], 1)-getVertexComp(triangle[3*i], 1);
    float z1=getVertexComp(triangle[3*i+2], 2)-getVertexComp(triangle[3*i], 2);

    float nx=y0*z1-z0*y1;
    float ny=z0*x1-x0*z1;
    float nz=x0*y1-y0*x1;

    float len=sqrt(nx*nx+ny*ny+nz*nz);

    if (len > 0)
    {
      nx/=len;
      ny/=len;
      nz/=len;

      for (int k=0; k<3; k++)
      {
        normal[3*triangle[3*i+k]]+=nx;
        normal[3*triangle[3*i+k]+1]+=ny;
        normal[3*triangle[3*i+k]+2]+=nz;
      }
    }
  }

  /* normalize to length 1 */

  normalizeNormals();
}